

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void iterator_suite::test_empty(void)

{
  bool v;
  array<int,_4UL> array;
  iterator local_50;
  iterator local_40;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_40 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_50 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  v = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                (&local_40,&local_50);
  boost::detail::test_impl
            ("span.begin() == span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x26b,"void iterator_suite::test_empty()",v);
  return;
}

Assistant:

void test_empty()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    BOOST_TEST(span.begin() == span.end());
}